

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

bool __thiscall cashew::JSPrinter::isNothing(JSPrinter *this,Ref node)

{
  bool bVar1;
  Value *pVVar2;
  Ref *pRVar3;
  size_t sVar4;
  bool local_19;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  pVVar2 = Ref::operator->((Ref *)&this_local);
  bVar1 = cashew::Value::isArray(pVVar2);
  local_19 = false;
  if (bVar1) {
    pRVar3 = Ref::operator[]((Ref *)&this_local,0);
    bVar1 = Ref::operator==(pRVar3,(IString *)TOPLEVEL);
    local_19 = false;
    if (bVar1) {
      pRVar3 = Ref::operator[]((Ref *)&this_local,1);
      pVVar2 = Ref::operator->(pRVar3);
      sVar4 = cashew::Value::size(pVVar2);
      local_19 = sVar4 == 0;
    }
  }
  return local_19;
}

Assistant:

bool isNothing(Ref node) {
    return node->isArray() && node[0] == TOPLEVEL && node[1]->size() == 0;
  }